

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.cpp
# Opt level: O0

component_flags crnlib::pixel_format_helpers::get_component_flags(pixel_format fmt)

{
  uint flags;
  pixel_format fmt_local;
  
  if (fmt != PIXEL_FMT_ETC1) {
    if (fmt == PIXEL_FMT_DXT5A) {
      return cCompFlagAValid;
    }
    if ((fmt != PIXEL_FMT_DXT1) && (fmt != PIXEL_FMT_ETC2)) {
      if (fmt == PIXEL_FMT_3DC) {
        return cCompFlagNormalMap|cCompFlagBValid|cCompFlagGValid|cCompFlagRValid;
      }
      if ((fmt == PIXEL_FMT_DXT2) || (fmt == PIXEL_FMT_DXT3)) {
        return cDefaultCompFlags;
      }
      if ((fmt != PIXEL_FMT_DXT4) && (fmt != PIXEL_FMT_DXT5)) {
        if (fmt == PIXEL_FMT_DXT1A) {
          return cDefaultCompFlags;
        }
        if (fmt != PIXEL_FMT_ETC2A) {
          if (fmt == PIXEL_FMT_A8R8G8B8) {
            return cDefaultCompFlags;
          }
          if (fmt == PIXEL_FMT_A8L8) {
            return cCompFlagGrayscale|cDefaultCompFlags;
          }
          if (fmt == PIXEL_FMT_A8) {
            return cCompFlagAValid;
          }
          if (fmt == PIXEL_FMT_DXT5_AGBR) {
            return cCompFlagNormalMap|cDefaultCompFlags;
          }
          if (fmt == PIXEL_FMT_DXT5_xGBR) {
            return cCompFlagNormalMap|cCompFlagBValid|cCompFlagGValid|cCompFlagRValid;
          }
          if (fmt == PIXEL_FMT_DXT5_xGxR) {
            return cCompFlagNormalMap|cCompFlagBValid|cCompFlagGValid|cCompFlagRValid;
          }
          if (fmt == PIXEL_FMT_ETC1S) {
            return cCompFlagBValid|cCompFlagGValid|cCompFlagRValid;
          }
          if (fmt != PIXEL_FMT_ETC2AS) {
            if (fmt == PIXEL_FMT_DXN) {
              return cCompFlagNormalMap|cCompFlagBValid|cCompFlagGValid|cCompFlagRValid;
            }
            if (fmt == PIXEL_FMT_DXT5_CCxY) {
              return cCompFlagLumaChroma|cCompFlagBValid|cCompFlagGValid|cCompFlagRValid;
            }
            if (fmt == PIXEL_FMT_R8G8B8) {
              return cCompFlagBValid|cCompFlagGValid|cCompFlagRValid;
            }
            if (fmt == PIXEL_FMT_L8) {
              return cCompFlagGrayscale|cCompFlagBValid|cCompFlagGValid|cCompFlagRValid;
            }
            return cCompFlagGrayscale|cDefaultCompFlags;
          }
        }
      }
      return cDefaultCompFlags;
    }
  }
  return cCompFlagBValid|cCompFlagGValid|cCompFlagRValid;
}

Assistant:

component_flags get_component_flags(pixel_format fmt)
        {
            // These flags are for *uncooked* pixels, i.e. after after adding Z to DXN maps, or converting YCC maps to RGB, etc.

            uint flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagAValid | cCompFlagGrayscale;
            switch (fmt)
            {
            case PIXEL_FMT_DXT1:
            case PIXEL_FMT_ETC1:
            case PIXEL_FMT_ETC2:
            case PIXEL_FMT_ETC1S:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid;
                break;
            }
            case PIXEL_FMT_DXT1A:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagAValid;
                break;
            }
            case PIXEL_FMT_DXT2:
            case PIXEL_FMT_DXT3:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagAValid;
                break;
            }
            case PIXEL_FMT_DXT4:
            case PIXEL_FMT_DXT5:
            case PIXEL_FMT_ETC2A:
            case PIXEL_FMT_ETC2AS:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagAValid;
                break;
            }
            case PIXEL_FMT_DXT5A:
            {
                flags = cCompFlagAValid;
                break;
            }
            case PIXEL_FMT_DXT5_CCxY:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagLumaChroma;
                break;
            }
            case PIXEL_FMT_DXT5_xGBR:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagNormalMap;
                break;
            }
            case PIXEL_FMT_DXT5_AGBR:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagAValid | cCompFlagNormalMap;
                break;
            }
            case PIXEL_FMT_DXT5_xGxR:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagNormalMap;
                break;
            }
            case PIXEL_FMT_3DC:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagNormalMap;
                break;
            }
            case PIXEL_FMT_DXN:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagNormalMap;
                break;
            }
            case PIXEL_FMT_R8G8B8:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid;
                break;
            }
            case PIXEL_FMT_A8R8G8B8:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagAValid;
                break;
            }
            case PIXEL_FMT_A8:
            {
                flags = cCompFlagAValid;
                break;
            }
            case PIXEL_FMT_L8:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagGrayscale;
                break;
            }
            case PIXEL_FMT_A8L8:
            {
                flags = cCompFlagRValid | cCompFlagGValid | cCompFlagBValid | cCompFlagAValid | cCompFlagGrayscale;
                break;
            }
            default:
            {
                CRNLIB_ASSERT(0);
                break;
            }
            }
            return static_cast<component_flags>(flags);
        }